

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<void> * kj::newPromiseAndFulfiller<void>(void)

{
  AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_> *pAVar1;
  PromiseFulfillerPair<void> *in_RDI;
  Own<kj::_::WeakFulfiller<void>_> wrapper;
  Own<kj::_::WeakFulfiller<void>_> local_48;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_>_> local_28;
  
  _::WeakFulfiller<void>::make();
  heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::WeakFulfiller<void>&>
            ((kj *)&local_28,local_48.ptr);
  pAVar1 = local_28.ptr;
  local_38.disposer = local_28.disposer;
  local_28.ptr = (AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_> *)0x0;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_>_>::dispose
            (&local_28);
  local_38.ptr = (PromiseNode *)0x0;
  (in_RDI->promise).super_PromiseBase.node.disposer = local_28.disposer;
  (in_RDI->promise).super_PromiseBase.node.ptr = (PromiseNode *)pAVar1;
  local_28.ptr = (AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_> *)0x0;
  (in_RDI->fulfiller).disposer = local_48.disposer;
  (in_RDI->fulfiller).ptr = &(local_48.ptr)->super_PromiseFulfiller<void>;
  local_48.ptr = (WeakFulfiller<void> *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::WeakFulfiller<void>_>::dispose(&local_48);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}